

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O0

void Fxu_MatrixGetDoubleVars
               (Fxu_Matrix *p,Fxu_Double *pDouble,int *piVarsC1,int *piVarsC2,int *pnVarsC1,
               int *pnVarsC2)

{
  Fxu_Pair *pFVar1;
  int local_58;
  int local_54;
  int nLits2;
  int nLits1;
  Fxu_Lit *pLit2;
  Fxu_Lit *pLit1;
  Fxu_Pair *pPair;
  int *pnVarsC2_local;
  int *pnVarsC1_local;
  int *piVarsC2_local;
  int *piVarsC1_local;
  Fxu_Double *pDouble_local;
  Fxu_Matrix *p_local;
  
  pFVar1 = (pDouble->lPairs).pHead;
  local_54 = 0;
  local_58 = 0;
  pLit2 = (pFVar1->pCube1->lLits).pHead;
  _nLits2 = (pFVar1->pCube2->lLits).pHead;
  while( true ) {
    while( true ) {
      while ((pLit2 != (Fxu_Lit *)0x0 && (_nLits2 != (Fxu_Lit *)0x0))) {
        if (pLit2->iVar == _nLits2->iVar) {
          pLit2 = pLit2->pHNext;
          _nLits2 = _nLits2->pHNext;
        }
        else if (pLit2->iVar < _nLits2->iVar) {
          piVarsC1[local_54] = pLit2->iVar;
          pLit2 = pLit2->pHNext;
          local_54 = local_54 + 1;
        }
        else {
          piVarsC2[local_58] = _nLits2->iVar;
          _nLits2 = _nLits2->pHNext;
          local_58 = local_58 + 1;
        }
      }
      if ((pLit2 == (Fxu_Lit *)0x0) || (_nLits2 != (Fxu_Lit *)0x0)) break;
      piVarsC1[local_54] = pLit2->iVar;
      pLit2 = pLit2->pHNext;
      local_54 = local_54 + 1;
    }
    if ((pLit2 != (Fxu_Lit *)0x0) || (_nLits2 == (Fxu_Lit *)0x0)) break;
    piVarsC2[local_58] = _nLits2->iVar;
    _nLits2 = _nLits2->pHNext;
    local_58 = local_58 + 1;
  }
  *pnVarsC1 = local_54;
  *pnVarsC2 = local_58;
  return;
}

Assistant:

void Fxu_MatrixGetDoubleVars( Fxu_Matrix * p, Fxu_Double * pDouble, 
    int piVarsC1[], int piVarsC2[], int * pnVarsC1, int * pnVarsC2 )
{
    Fxu_Pair * pPair;
	Fxu_Lit * pLit1, * pLit2;
    int nLits1, nLits2;

    // get the first pair
    pPair = pDouble->lPairs.pHead;
    // init the parameters
	nLits1 = 0;
	nLits2 = 0;
	pLit1 = pPair->pCube1->lLits.pHead;
	pLit2 = pPair->pCube2->lLits.pHead;
	while ( 1 )
	{
		if ( pLit1 && pLit2 )
		{
			if ( pLit1->iVar == pLit2->iVar )
			{ // ensure cube-free
				pLit1 = pLit1->pHNext;
				pLit2 = pLit2->pHNext;
			}
			else if ( pLit1->iVar < pLit2->iVar )
            {
                piVarsC1[nLits1++] = pLit1->iVar;
 				pLit1 = pLit1->pHNext;
           }
			else
            {
                piVarsC2[nLits2++] = pLit2->iVar;
				pLit2 = pLit2->pHNext;
            }
		}
		else if ( pLit1 && !pLit2 )
        {
            piVarsC1[nLits1++] = pLit1->iVar;
    		pLit1 = pLit1->pHNext;
        }
		else if ( !pLit1 && pLit2 )
        {
            piVarsC2[nLits2++] = pLit2->iVar;
			pLit2 = pLit2->pHNext;
        }
		else
			break;
	}
    *pnVarsC1 = nLits1;
    *pnVarsC2 = nLits2;
}